

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O2

bool __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::saveSettingsFile(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *this,char *filename,bool onlyChanged,int solvemode)

{
  byte *pbVar1;
  double dVar2;
  int iVar3;
  ostream *poVar4;
  char *pcVar5;
  string *psVar6;
  int i;
  long lVar7;
  ofstream file;
  undefined8 auStack_228 [2];
  uint auStack_218 [122];
  
  std::ofstream::ofstream(&file,filename,_S_out);
  *(undefined8 *)((long)auStack_228 + *(long *)(_file + -0x18)) = 0x10;
  *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) =
       *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) & 0xfffffefb | 0x100;
  iVar3 = *(int *)((long)auStack_218 + *(long *)(_file + -0x18) + 8);
  if (iVar3 == 0) {
    pbVar1 = (byte *)((long)auStack_218 + *(long *)(_file + -0x18));
    *pbVar1 = *pbVar1 | 0x20;
    *(undefined8 *)((long)auStack_228 + *(long *)(_file + -0x18)) = 8;
    *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) & 0xfffffefb | 4;
    poVar4 = std::operator<<((ostream *)&file,"# SoPlexBase version ");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,8);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    poVar4 = std::operator<<(poVar4,".");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
    std::operator<<(poVar4,"\n");
    psVar6 = (string *)
             &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::Settings::boolParam;
    for (lVar7 = 0; lVar7 != 0x1a; lVar7 = lVar7 + 1) {
      if ((!onlyChanged) ||
         (this->_currentSettings->_boolParamValues[lVar7] != (bool)(&DAT_0054b628)[lVar7])) {
        std::operator<<((ostream *)&file,"\n");
        poVar4 = std::operator<<((ostream *)&file,"# ");
        poVar4 = std::operator<<(poVar4,psVar6 + 0x340);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&file,"# range {true, false}, default ");
        pcVar5 = "false\n";
        if ((&DAT_0054b628)[lVar7] != '\0') {
          pcVar5 = "true\n";
        }
        std::operator<<(poVar4,pcVar5);
        poVar4 = std::operator<<((ostream *)&file,"bool:");
        poVar4 = std::operator<<(poVar4,psVar6);
        poVar4 = std::operator<<(poVar4," = ");
        pcVar5 = "false\n";
        if (this->_currentSettings->_boolParamValues[lVar7] != false) {
          pcVar5 = "true\n";
        }
        std::operator<<(poVar4,pcVar5);
      }
      psVar6 = psVar6 + 0x20;
    }
    psVar6 = (string *)
             &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::Settings::intParam;
    for (lVar7 = 0; lVar7 != 0x70; lVar7 = lVar7 + 4) {
      if ((!onlyChanged) ||
         (*(int *)((long)this->_currentSettings->_intParamValues + lVar7) !=
          *(int *)((long)&DAT_0054bd50 + lVar7))) {
        std::operator<<((ostream *)&file,"\n");
        poVar4 = std::operator<<((ostream *)&file,"# ");
        poVar4 = std::operator<<(poVar4,psVar6 + 0x380);
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&file,"# range [");
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)((long)&DAT_0054bdc0 + lVar7));
        poVar4 = std::operator<<(poVar4,",");
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)((long)&DAT_0054be30 + lVar7));
        poVar4 = std::operator<<(poVar4,"], default ");
        poVar4 = (ostream *)
                 std::ostream::operator<<((ostream *)poVar4,*(int *)((long)&DAT_0054bd50 + lVar7));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&file,"int:");
        poVar4 = std::operator<<(poVar4,psVar6);
        poVar4 = std::operator<<(poVar4," = ");
        poVar4 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)poVar4,
                            *(int *)((long)this->_currentSettings->_intParamValues + lVar7));
        std::operator<<(poVar4,"\n");
      }
      psVar6 = psVar6 + 0x20;
    }
    *(undefined8 *)((long)auStack_228 + *(long *)(_file + -0x18)) = 8;
    *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) =
         *(uint *)((long)auStack_218 + *(long *)(_file + -0x18)) & 0xfffffefb | 0x100;
    psVar6 = (string *)
             &SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              ::Settings::realParam;
    for (lVar7 = 0; lVar7 != 0xd8; lVar7 = lVar7 + 8) {
      if (onlyChanged) {
        dVar2 = *(double *)((long)this->_currentSettings->_realParamValues + lVar7);
        if ((dVar2 != *(double *)((long)&DAT_0054c568 + lVar7)) ||
           (NAN(dVar2) || NAN(*(double *)((long)&DAT_0054c568 + lVar7)))) goto LAB_002a00c9;
      }
      else {
LAB_002a00c9:
        std::operator<<((ostream *)&file,"\n");
        poVar4 = std::operator<<((ostream *)&file,"# ");
        poVar4 = std::operator<<(poVar4,psVar6 + 0x360);
        std::operator<<(poVar4,"\n");
        std::operator<<((ostream *)&file,"# range [");
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_0054c640 + lVar7));
        std::operator<<(poVar4,",");
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_0054c718 + lVar7));
        std::operator<<(poVar4,"], default ");
        poVar4 = std::ostream::_M_insert<double>(*(double *)((long)&DAT_0054c568 + lVar7));
        std::operator<<(poVar4,"\n");
        poVar4 = std::operator<<((ostream *)&file,"real:");
        poVar4 = std::operator<<(poVar4,psVar6);
        std::operator<<(poVar4," = ");
        poVar4 = std::ostream::_M_insert<double>
                           (*(double *)((long)this->_currentSettings->_realParamValues + lVar7));
        std::operator<<(poVar4,"\n");
      }
      psVar6 = psVar6 + 0x20;
    }
    if ((!onlyChanged) || ((this->_solver).random.seedshift != 0)) {
      std::operator<<((ostream *)&file,"\n");
      std::operator<<((ostream *)&file,"# initial random seed used for perturbation\n");
      poVar4 = std::operator<<((ostream *)&file,"# range [0, ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      poVar4 = std::operator<<(poVar4,"], default ");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0);
      std::operator<<(poVar4,"\n");
      poVar4 = std::operator<<((ostream *)&file,"uint:random_seed = ");
      poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
      std::operator<<(poVar4,"\n");
    }
  }
  std::ofstream::~ofstream(&file);
  return iVar3 == 0;
}

Assistant:

bool SoPlexBase<R>::saveSettingsFile(const char* filename, const bool onlyChanged,
                                     int solvemode) const
{
   assert(filename != nullptr);

   std::ofstream file(filename);
   SPxOut::setScientific(file, 16);

   if(!file.good())
      return false;

   file.setf(std::ios::left);

   SPxOut::setFixed(file);

   file << "# SoPlexBase version " << SOPLEX_VERSION / 100 << "." << (SOPLEX_VERSION / 10) % 10 << "."
        << SOPLEX_VERSION % 10 << "\n";

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->boolParam.description[i] << "\n";
      file << "# range {true, false}, default " << (_currentSettings->boolParam.defaultValue[i] ?
            "true\n" : "false\n");
      file << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
           (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->intParam.description[i] << "\n";
      file << "# range [" << _currentSettings->intParam.lower[i] << "," <<
           _currentSettings->intParam.upper[i]
           << "], default " << _currentSettings->intParam.defaultValue[i] << "\n";
      file << "int:" << _currentSettings->intParam.name[i] << " = " <<
           _currentSettings->_intParamValues[i] << "\n";
   }

   SPxOut::setScientific(file);

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->realParam.description[i] << "\n";
      file << "# range [" << _currentSettings->realParam.lower[i] << "," <<
           _currentSettings->realParam.upper[i]
           << "], default " << _currentSettings->realParam.defaultValue[i] << "\n";
      file << "real:" << _currentSettings->realParam.name[i] << " = " <<
           _currentSettings->_realParamValues[i] << "\n";
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(onlyChanged
            && _currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      file << "\n";
      file << "# " << _currentSettings->rationalParam.description[i] << "\n";
      file << "# range [" << _currentSettings->rationalParam.lower[i] << "," <<
           _currentSettings->rationalParam.upper[i]
           << "], default " << _currentSettings->rationalParam.defaultValue[i] << "\n";
      file << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
           _currentSettings->_rationalParamValues[i] << "\n";
   }

#endif

   if(!onlyChanged || _solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      file << "\n";
      file << "# initial random seed used for perturbation\n";
      file << "# range [0, " << UINT_MAX << "], default " << SOPLEX_DEFAULT_RANDOM_SEED << "\n";
      file << "uint:random_seed = " << _solver.random.getSeed() << "\n";
   }

   return true;
}